

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::analysis::DebugInfoManager::BuildDebugInlinedAtChain
          (DebugInfoManager *this,uint32_t callee_inlined_at,DebugInlinedAtContext *inlined_at_ctx)

{
  uint32_t uVar1;
  uint32_t inlined_operand;
  uint32_t uVar2;
  CommonDebugInfoInstructions CVar3;
  Instruction *this_00;
  mapped_type *pmVar4;
  Instruction *insert_before;
  key_type local_38;
  uint32_t local_34;
  
  uVar1 = 0;
  if ((inlined_at_ctx->call_inst_scope_).lexical_scope_ != 0) {
    uVar1 = DebugInlinedAtContext::GetDebugInlinedAtChain(inlined_at_ctx,callee_inlined_at);
    if (uVar1 == 0) {
      inlined_operand =
           CreateDebugInlinedAt
                     (this,inlined_at_ctx->call_inst_line_,&inlined_at_ctx->call_inst_scope_);
      uVar1 = 0;
      if (inlined_operand != 0) {
        if (callee_inlined_at == 0) {
          local_38 = 0;
          pmVar4 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&inlined_at_ctx->callee_inlined_at2chain_,&local_38);
          *pmVar4 = inlined_operand;
          uVar1 = inlined_operand;
        }
        else {
          insert_before = (Instruction *)0x0;
          uVar2 = callee_inlined_at;
          do {
            this_00 = CloneDebugInlinedAt(this,uVar2,insert_before);
            if (this_00 == (Instruction *)0x0) {
              __assert_fail("new_inlined_at_in_chain != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                            ,0x130,
                            "uint32_t spvtools::opt::analysis::DebugInfoManager::BuildDebugInlinedAtChain(uint32_t, DebugInlinedAtContext *)"
                           );
            }
            if (uVar1 == 0) {
              uVar1 = 0;
              if (this_00->has_result_id_ == true) {
                uVar1 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
              }
            }
            if (insert_before != (Instruction *)0x0) {
              uVar2 = 0;
              if (this_00->has_result_id_ == true) {
                uVar2 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
              }
              anon_unknown_0::SetInlinedOperand(insert_before,uVar2);
            }
            CVar3 = Instruction::GetCommonDebugOpcode(this_00);
            if (CVar3 != CommonDebugInfoDebugInlinedAt) {
              __assert_fail("dbg_inlined_at->GetCommonDebugOpcode() == CommonDebugInfoDebugInlinedAt"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                            ,0x43,
                            "uint32_t spvtools::opt::analysis::(anonymous namespace)::GetInlinedOperand(Instruction *)"
                           );
            }
            uVar2 = 0;
            if (6 < (uint)((int)((ulong)((long)(this_00->operands_).
                                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(this_00->operands_).
                                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                          -0x55555555)) {
              uVar2 = Instruction::GetSingleWordOperand(this_00,6);
            }
            insert_before = this_00;
          } while (uVar2 != 0);
          anon_unknown_0::SetInlinedOperand(this_00,inlined_operand);
          local_34 = callee_inlined_at;
          pmVar4 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&inlined_at_ctx->callee_inlined_at2chain_,&local_34);
          *pmVar4 = uVar1;
        }
      }
    }
  }
  return uVar1;
}

Assistant:

uint32_t DebugInfoManager::BuildDebugInlinedAtChain(
    uint32_t callee_inlined_at, DebugInlinedAtContext* inlined_at_ctx) {
  if (inlined_at_ctx->GetScopeOfCallInstruction().GetLexicalScope() ==
      kNoDebugScope)
    return kNoInlinedAt;

  // Reuse the already generated DebugInlinedAt chain if exists.
  uint32_t already_generated_chain_head_id =
      inlined_at_ctx->GetDebugInlinedAtChain(callee_inlined_at);
  if (already_generated_chain_head_id != kNoInlinedAt) {
    return already_generated_chain_head_id;
  }

  const uint32_t new_dbg_inlined_at_id =
      CreateDebugInlinedAt(inlined_at_ctx->GetLineOfCallInstruction(),
                           inlined_at_ctx->GetScopeOfCallInstruction());
  if (new_dbg_inlined_at_id == kNoInlinedAt) return kNoInlinedAt;

  if (callee_inlined_at == kNoInlinedAt) {
    inlined_at_ctx->SetDebugInlinedAtChain(kNoInlinedAt, new_dbg_inlined_at_id);
    return new_dbg_inlined_at_id;
  }

  uint32_t chain_head_id = kNoInlinedAt;
  uint32_t chain_iter_id = callee_inlined_at;
  Instruction* last_inlined_at_in_chain = nullptr;
  do {
    Instruction* new_inlined_at_in_chain = CloneDebugInlinedAt(
        chain_iter_id, /* insert_before */ last_inlined_at_in_chain);
    assert(new_inlined_at_in_chain != nullptr);

    // Set DebugInlinedAt of the new scope as the head of the chain.
    if (chain_head_id == kNoInlinedAt)
      chain_head_id = new_inlined_at_in_chain->result_id();

    // Previous DebugInlinedAt of the chain must point to the new
    // DebugInlinedAt as its Inlined operand to build a recursive
    // chain.
    if (last_inlined_at_in_chain != nullptr) {
      SetInlinedOperand(last_inlined_at_in_chain,
                        new_inlined_at_in_chain->result_id());
    }
    last_inlined_at_in_chain = new_inlined_at_in_chain;

    chain_iter_id = GetInlinedOperand(new_inlined_at_in_chain);
  } while (chain_iter_id != kNoInlinedAt);

  // Put |new_dbg_inlined_at_id| into the end of the chain.
  SetInlinedOperand(last_inlined_at_in_chain, new_dbg_inlined_at_id);

  // Keep the new chain information that will be reused it.
  inlined_at_ctx->SetDebugInlinedAtChain(callee_inlined_at, chain_head_id);
  return chain_head_id;
}